

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

ArgConvertResult<(absl::FormatConversionCharSet)262144>
absl::str_format_internal::FormatConvertImpl
          (VoidPtr v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  FormatSinkImpl *in_R8;
  FormatConversionSpecImpl conv_00;
  undefined1 local_90 [8];
  IntDigits as_digits;
  FormatSinkImpl *sink_local;
  FormatConversionSpecImpl conv_local;
  VoidPtr v_local;
  
  conv_00._0_4_ = conv.precision_;
  if (v.value == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)(as_digits.storage_ + 0x28),
               "(nil)");
    FormatSinkImpl::Append(sink,stack0xffffffffffffffb0);
    v_local.value._7_1_ = true;
  }
  else {
    anon_unknown_53::IntDigits::PrintAsHexLower<unsigned_long>((IntDigits *)local_90,v.value);
    conv_00.width_ = 0;
    conv_00.precision_ = (int)sink;
    v_local.value._7_1_ =
         anon_unknown_53::ConvertIntImplInnerSlow
                   ((anon_unknown_53 *)local_90,conv._0_8_,conv_00,in_R8);
  }
  return (ArgConvertResult<(absl::FormatConversionCharSet)262144>)v_local.value._7_1_;
}

Assistant:

ArgConvertResult<FormatConversionCharSetInternal::p> FormatConvertImpl(
    VoidPtr v, const FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  if (!v.value) {
    sink->Append("(nil)");
    return {true};
  }
  IntDigits as_digits;
  as_digits.PrintAsHexLower(v.value);
  return {ConvertIntImplInnerSlow(as_digits, conv, sink)};
}